

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void menu_draw_proc(Am_Object *menu,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  uint *puVar1;
  Am_Draw_Method_Type *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int width;
  int height;
  Am_Value *pAVar6;
  _func_int *p_Var7;
  uint uVar8;
  uint uVar9;
  uint left;
  uint top;
  Am_Widget_Look look;
  Computed_Colors_Record local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Draw_Method method;
  
  pAVar6 = Am_Object::Get(menu,100,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(menu,0x65,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(menu,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(menu,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(menu,0x17f,0);
  look.value = Am_MOTIF_LOOK_val;
  if ((pAVar6->type != 1) && (pAVar6->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&look,pAVar6);
  }
  look.value = (Am_Widget_Look_vals)(pAVar6->value).float_value;
  pAVar6 = Am_Object::Get(menu,0x1ad,0);
  local_68.data = (Computed_Colors_Record_Data *)(pAVar6->value).wrapper_value;
  if (local_68.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((local_68.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  left = iVar4 + x_offset;
  top = iVar5 + y_offset;
  if (look.value == Am_MOTIF_LOOK_val) {
    Am_Draw_Motif_Box(left,top,width,height,false,&local_68,drawonable);
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    Am_Draw_Windows_Box(left,top,width,height,false,&local_68,drawonable);
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    Am_Object::Am_Object(&local_50,&Am_Menu_In_Scrolling_Menu);
    bVar3 = Am_Object::Is_Instance_Of(menu,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (!bVar3) {
      Am_Object::Am_Object(&local_58,&Am_Menu_Bar);
      bVar3 = Am_Object::Is_Instance_Of(menu,&local_58);
      Am_Object::~Am_Object(&local_58);
      p_Var7 = drawonable->_vptr_Am_Drawonable[0x2c];
      if (bVar3) {
        left = left - 1;
        top = top - 1;
        uVar8 = width + 2;
        uVar9 = height + 1;
      }
      else {
        (*p_Var7)(drawonable,&Am_Black,&Am_No_Style,(ulong)(left + 3),(ulong)(top + 3),
                  (ulong)(width - 3),(ulong)(height - 3),0);
        uVar8 = width - 1;
        uVar9 = height - 1;
        p_Var7 = drawonable->_vptr_Am_Drawonable[0x2c];
      }
      (*p_Var7)(drawonable,&Am_Black,&Am_White,(ulong)left,(ulong)top,(ulong)uVar8,(ulong)uVar9,0);
    }
  }
  method.from_wrapper = (Am_Method_Wrapper *)0x0;
  method.Call = (Am_Draw_Method_Type *)0x0;
  pAVar6 = Am_Object::Get(&Am_Aggregate,2000,0);
  Am_Draw_Method::operator=(&method,pAVar6);
  pAVar2 = method.Call;
  Am_Object::Am_Object(&local_60,menu);
  (*pAVar2)((Am_Object_Data *)&local_60,drawonable,x_offset,y_offset);
  Am_Object::~Am_Object(&local_60);
  if (local_68.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((local_68.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*((local_68.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, menu_draw,
                 (Am_Object menu, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)menu.Get(Am_LEFT) + x_offset;
  int top = (int)menu.Get(Am_TOP) + y_offset;
  int width = menu.Get(Am_WIDTH);
  int height = menu.Get(Am_HEIGHT);
  Am_Widget_Look look = menu.Get(Am_WIDGET_LOOK);
  Computed_Colors_Record color_rec = menu.Get(Am_STYLE_RECORD);

  am_rect r(left, top, width, height);

  // first draw the border
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    Am_Draw_Motif_Box(left, top, width, height, false, color_rec, drawonable);
    break;

  case Am_WINDOWS_LOOK_val: {
    Am_Draw_Windows_Box(left, top, width, height, false, color_rec, drawonable);
    break;
  }
  case Am_MACINTOSH_LOOK_val:
    if (menu.Is_Instance_Of(Am_Menu_In_Scrolling_Menu))
      ; //don't draw a background if in a scrolling menu
    else if (menu.Is_Instance_Of(Am_Menu_Bar)) // drawing menu bar
      drawonable->Draw_Rectangle(Am_Black, Am_White, r.left - 1, r.top - 1,
                                 r.width + 2, r.height + 1);
    else // drawing a menu
    {
      drawonable->Draw_Rectangle(Am_Black, Am_No_Style, r.left + 3, r.top + 3,
                                 r.width - 3, r.height - 3);
      drawonable->Draw_Rectangle(Am_Black, Am_White, r.left, r.top, r.width - 1,
                                 r.height - 1);
    }
    break;
  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  // now draw the graphical parts of the aggregate, using Am_Aggregate's
  // draw method.
  Am_Draw_Method method;
  method = Am_Aggregate.Get(Am_DRAW_METHOD);
  method.Call(menu, drawonable, x_offset, y_offset);
}